

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_get_file_modified_time(char *pFilename,time_t *pTime)

{
  int iVar1;
  undefined1 local_b0 [8];
  stat file_stat;
  time_t *pTime_local;
  char *pFilename_local;
  
  file_stat.__glibc_reserved[2] = (__syscall_slong_t)pTime;
  iVar1 = stat(pFilename,(stat *)local_b0);
  if (iVar1 == 0) {
    *(__syscall_slong_t *)file_stat.__glibc_reserved[2] = file_stat.st_atim.tv_nsec;
  }
  pFilename_local._4_4_ = (uint)(iVar1 == 0);
  return pFilename_local._4_4_;
}

Assistant:

static mz_bool mz_zip_get_file_modified_time(const char *pFilename, MZ_TIME_T *pTime)
{
    struct MZ_FILE_STAT_STRUCT file_stat;

    /* On Linux with x86 glibc, this call will fail on large files (I think >= 0x80000000 bytes) unless you compiled with _LARGEFILE64_SOURCE. Argh. */
    if (MZ_FILE_STAT(pFilename, &file_stat) != 0)
        return MZ_FALSE;

    *pTime = file_stat.st_mtime;

    return MZ_TRUE;
}